

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

string * __thiscall
tcu::Format::Hex<8ul>::toString_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  allocator<char> local_39;
  char shortFmt [9];
  char buf [19];
  
  builtin_strncpy(shortFmt,"0x%08llx",9);
  deSprintf(buf,0x13,shortFmt,*this);
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,buf,&local_39)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string toString (void) const
	{
		DE_STATIC_ASSERT(0 < NumDigits && NumDigits <= 16);

		const char longFmt[]	= {'0', 'x', '%', '0', '0' + NumDigits/10, '0' + NumDigits%10, 'l', 'l', 'x', 0};
		const char shortFmt[]	= {'0', 'x', '%', '0', '0' + NumDigits, 'l', 'l', 'x', 0};

		char buf[sizeof(deUint64)*2 + 3];
		deSprintf(buf, sizeof(buf), NumDigits > 9 ? longFmt : shortFmt, value);

		return std::string(buf);
	}